

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O1

QVariant * __thiscall
QSettingsPrivate::value
          (QVariant *__return_storage_ptr__,QSettingsPrivate *this,QAnyStringView key,
          QVariant *defaultValue)

{
  long in_FS_OFFSET;
  optional<QVariant> r;
  QString local_70;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((undefined1  [16])key & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0) {
    value();
  }
  else {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    actualKey(&local_70,this,key);
    (*(this->super_QObjectPrivate).super_QObjectData._vptr_QObjectData[6])(&local_58,this,&local_70)
    ;
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)local_38 == '\x01') {
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = local_58._16_8_;
      *(undefined1 **)&(__return_storage_ptr__->d).field_0x18 = puStack_40;
      (__return_storage_ptr__->d).data.shared = local_58.shared;
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = local_58._8_8_;
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = (undefined1 *)0x0;
      local_58._16_8_ = (undefined1 *)0x0;
      puStack_40 = (undefined1 *)0x2;
      local_38 = (undefined1 *)((ulong)local_38 & 0xffffffffffffff00);
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    else if (defaultValue == (QVariant *)0x0) {
      (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
      *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
    }
    else {
      ::QVariant::QVariant(__return_storage_ptr__,defaultValue);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QSettingsPrivate::value(QAnyStringView key, const QVariant *defaultValue) const
{
    if (key.isEmpty()) {
        qWarning("QSettings::value: Empty key passed");
        return QVariant();
    }
    if (std::optional r = get(actualKey(key)))
        return std::move(*r);
    if (defaultValue)
        return *defaultValue;
    return QVariant();
}